

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_uint * nk_find_value(nk_window *win,nk_hash name)

{
  nk_uint *pnVar1;
  nk_hash *pnVar2;
  nk_table *pnVar3;
  nk_table **ppnVar4;
  ulong uVar5;
  nk_hash *pnVar6;
  bool bVar7;
  
  ppnVar4 = &win->tables;
  uVar5 = (ulong)win->table_size;
  do {
    pnVar3 = *ppnVar4;
    if (pnVar3 == (nk_table *)0x0) {
      return (nk_uint *)0x0;
    }
    pnVar6 = pnVar3->keys + 0x34;
    while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
      pnVar1 = pnVar6 + 1;
      pnVar2 = pnVar6 + -0x34;
      pnVar6 = pnVar1;
      if (*pnVar2 == name) {
        pnVar3->seq = win->seq;
        return pnVar1;
      }
    }
    ppnVar4 = &pnVar3->next;
    uVar5 = 0x35;
  } while( true );
}

Assistant:

NK_INTERN nk_uint*
nk_find_value(struct nk_window *win, nk_hash name)
{
    nk_ushort size = win->table_size;
    struct nk_table *iter = win->tables;
    while (iter) {
        nk_ushort i = 0;
        for (i = 0; i < size; ++i) {
            if (iter->keys[i] == name) {
                iter->seq = win->seq;
                return &iter->values[i];
            }
        }
        size = NK_VALUE_PAGE_CAPACITY;
        iter = iter->next;
    }
    return 0;
}